

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void issue288(void)

{
  roaring_bitmap_t *r;
  roaring_bitmap_t *r_00;
  uint64_t uVar1;
  
  r = roaring_bitmap_create();
  r_00 = roaring_bitmap_create();
  uVar1 = roaring_bitmap_get_cardinality(r);
  _assert_true((ulong)(uVar1 == 0),"roaring_bitmap_get_cardinality(r1) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x14f);
  uVar1 = roaring_bitmap_get_cardinality(r_00);
  _assert_true((ulong)(uVar1 == 0),"roaring_bitmap_get_cardinality(r2) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x150);
  roaring_bitmap_add(r,0x2a);
  uVar1 = roaring_bitmap_get_cardinality(r);
  _assert_true((ulong)(uVar1 == 1),"roaring_bitmap_get_cardinality(r1) == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x153);
  roaring_bitmap_overwrite(r,r_00);
  uVar1 = roaring_bitmap_get_cardinality(r);
  _assert_true((ulong)(uVar1 == 0),"roaring_bitmap_get_cardinality(r1) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x155);
  uVar1 = roaring_bitmap_get_cardinality(r_00);
  _assert_true((ulong)(uVar1 == 0),"roaring_bitmap_get_cardinality(r2) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x156);
  roaring_bitmap_free(r);
  roaring_bitmap_free(r_00);
  return;
}

Assistant:

DEFINE_TEST(issue288) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    assert_true(roaring_bitmap_get_cardinality(r1) == 0);
    assert_true(roaring_bitmap_get_cardinality(r2) == 0);

    roaring_bitmap_add(r1, 42);
    assert_true(roaring_bitmap_get_cardinality(r1) == 1);
    roaring_bitmap_overwrite(r1, r2);
    assert_true(roaring_bitmap_get_cardinality(r1) == 0);
    assert_true(roaring_bitmap_get_cardinality(r2) == 0);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);
}